

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall
LogicalOperationNode::LogicalOperationNode
          (LogicalOperationNode *this,LogicalOperation operation_to,shared_ptr<Node> *lhs,
          shared_ptr<Node> *rhs)

{
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_Evaluate_00117c58;
  this->operation = operation_to;
  std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->lhs_node).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>,
             &lhs->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->rhs_node).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>,
             &rhs->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

LogicalOperationNode::LogicalOperationNode(const LogicalOperation operation_to,
                                           const shared_ptr<Node> &lhs, const shared_ptr<Node> &rhs)
        : operation(operation_to)
        , lhs_node(lhs)
        , rhs_node(rhs)
    {}